

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_write_native_straddle(mpack_writer_t *writer,char *p,size_t count)

{
  mpack_error_t mVar1;
  size_t sVar2;
  size_t count_local;
  char *p_local;
  mpack_writer_t *writer_local;
  
  mVar1 = mpack_writer_error(writer);
  if (mVar1 == mpack_ok) {
    mpack_writer_buffer_left(writer);
    if (writer->flush == (mpack_writer_flush_t)0x0) {
      mpack_writer_flag_error(writer,mpack_error_too_big);
    }
    else {
      mpack_writer_flush_unchecked(writer);
      mVar1 = mpack_writer_error(writer);
      if (mVar1 == mpack_ok) {
        sVar2 = mpack_writer_buffer_left(writer);
        if (sVar2 < count) {
          (*writer->flush)(writer,p,count);
          mpack_writer_error(writer);
        }
        else {
          memcpy(writer->current,p,count);
          writer->current = writer->current + count;
        }
      }
    }
  }
  return;
}

Assistant:

MPACK_NOINLINE static void mpack_write_native_straddle(mpack_writer_t* writer, const char* p, size_t count) {
    mpack_assert(count == 0 || p != NULL, "data pointer for %i bytes is NULL", (int)count);

    if (mpack_writer_error(writer) != mpack_ok)
        return;
    mpack_log("big write for %i bytes from %p, %i space left in buffer\n",
            (int)count, p, (int)mpack_writer_buffer_left(writer));
    mpack_assert(count > mpack_writer_buffer_left(writer),
            "big write requested for %i bytes, but there is %i available "
            "space in buffer. should have called mpack_write_native() instead",
            (int)count, (int)(mpack_writer_buffer_left(writer)));

    // we'll need a flush function
    if (!writer->flush) {
        mpack_writer_flag_error(writer, mpack_error_too_big);
        return;
    }

    // flush the buffer
    mpack_writer_flush_unchecked(writer);
    if (mpack_writer_error(writer) != mpack_ok)
        return;

    // note that an intrusive flush function (such as mpack_growable_writer_flush())
    // may have changed size and/or reset used to a non-zero value. we treat both as
    // though they may have changed, and there may still be data in the buffer.

    // flush the extra data directly if it doesn't fit in the buffer
    if (count > mpack_writer_buffer_left(writer)) {
        writer->flush(writer, p, count);
        if (mpack_writer_error(writer) != mpack_ok)
            return;
    } else {
        mpack_memcpy(writer->current, p, count);
        writer->current += count;
    }
}